

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::apply_etm(Base *this,ETM *etm,SVector *vec)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  pointer pNVar4;
  size_t in_RDX;
  long in_RSI;
  long in_RDI;
  const_iterator it_1;
  Nonzero *e;
  iterator __end2;
  iterator __begin2;
  SVector *__range2;
  const_iterator it;
  Nonzero *v;
  iterator __end1;
  iterator __begin1;
  SVector *__range1;
  bool found;
  double mult;
  SVector *in_stack_ffffffffffffff28;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  DVector *in_stack_ffffffffffffff40;
  __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_80;
  reference local_78;
  Nonzero *local_70;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_68;
  size_t local_60;
  Nonzero *local_58;
  __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_50;
  reference local_48;
  Nonzero *local_40;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_38 [2];
  byte local_21;
  double local_20;
  size_t local_18;
  long local_10;
  
  local_20 = 0.0;
  local_21 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38[0]._M_current = (Nonzero *)SVector::begin(in_stack_ffffffffffffff28);
  local_40 = (Nonzero *)SVector::end(in_stack_ffffffffffffff28);
  while (bVar2 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff30,
                            (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                             *)in_stack_ffffffffffffff28), bVar2) {
    local_48 = __gnu_cxx::
               __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
               ::operator*(local_38);
    if (local_48->index == *(size_t *)(local_10 + 0x18)) {
      local_21 = 1;
      local_20 = local_48->value;
      local_48->value = 0.0;
    }
    __gnu_cxx::
    __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator++(local_38);
  }
  if ((local_21 & 1) != 0) {
    local_50._M_current = (Nonzero *)SVector::cbegin(in_stack_ffffffffffffff28);
    while( true ) {
      local_58 = (Nonzero *)SVector::cend(in_stack_ffffffffffffff28);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar2) break;
      pNVar4 = __gnu_cxx::
               __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
               ::operator->(&local_50);
      dVar1 = pNVar4->value;
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator->(&local_50);
      pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      *pdVar3 = dVar1;
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator++(&local_50);
    }
    local_60 = local_18;
    local_68._M_current = (Nonzero *)SVector::begin(in_stack_ffffffffffffff28);
    local_70 = (Nonzero *)SVector::end(in_stack_ffffffffffffff28);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff30,
                              (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                               *)in_stack_ffffffffffffff28), bVar2) {
      local_78 = __gnu_cxx::
                 __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                 ::operator*(&local_68);
      pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if ((0.0 < *pdVar3) ||
         (pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38),
         *pdVar3 <= 0.0 && *pdVar3 != 0.0)) {
        pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        local_78->value = *pdVar3 * local_20 + local_78->value;
        pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        *pdVar3 = 0.0;
      }
      __gnu_cxx::
      __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator++(&local_68);
    }
    local_80._M_current = (Nonzero *)SVector::cbegin(in_stack_ffffffffffffff28);
    while( true ) {
      SVector::cend(in_stack_ffffffffffffff28);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator->(&local_80);
      pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (0.0 < *pdVar3) {
LAB_001e3d83:
        in_stack_ffffffffffffff38 = local_18;
        pNVar4 = __gnu_cxx::
                 __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                 ::operator->(&local_80);
        in_stack_ffffffffffffff40 = (DVector *)pNVar4->index;
        in_stack_ffffffffffffff30 =
             (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
              *)(in_RDI + 0x18);
        __gnu_cxx::
        __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
        ::operator->(&local_80);
        DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        SVector::add_value((SVector *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                           (double)in_stack_ffffffffffffff30);
        __gnu_cxx::
        __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
        ::operator->(&local_80);
        pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        *pdVar3 = 0.0;
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
        ::operator->(&local_80);
        pdVar3 = DVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (*pdVar3 <= 0.0 && *pdVar3 != 0.0) goto LAB_001e3d83;
      }
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator++(&local_80);
    }
  }
  return;
}

Assistant:

void Base::apply_etm(const ETM &etm, SVector &vec) {
  double mult = 0.0;
  bool found = false;
  // Find nonzero multiplier in vec_i
  for (auto &v : vec) {
    if (v.index == etm.col) {
      found = true;
      mult = v.value;
      v.value =
          0.0; // otherwise v_col = v_col + v_col * mult; should be v_col =
               // v_col * mult
    }
  }
  if (found) {
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it)
      work[it->index] = it->value;
    for (auto &e : vec) {
      if (work[e.index] > 0.0 or work[e.index] < 0.0) {
        e.value += work[e.index] * mult;
        work[e.index] = 0.0;
      }
    }
    for (auto it = etm.eta.cbegin(); it != etm.eta.cend(); ++it) {
      if (work[it->index] > 0.0 or work[it->index] < 0.0) {
        vec.add_value(it->index, work[it->index] * mult);
        work[it->index] = 0.0;
      }
    }
  }
}